

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * getUniformName(string *__return_storage_ptr__,string *_str)

{
  string sStack_88;
  string local_68;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  
  vera::split(&values,_str,'.',false);
  vera::purifyString(&sStack_88,
                     values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  vera::toUnderscore(&local_68,&sStack_88);
  vera::toLower(&local_48,&local_68);
  std::operator+(__return_storage_ptr__,"u_",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

std::string getUniformName(const std::string& _str) {
    std::vector<std::string> values = vera::split(_str, '.');
    return "u_" + vera::toLower( vera::toUnderscore( vera::purifyString( values[0] ) ) );
}